

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::ImageButton(Sprite *sprite,Vector2f *size,int framePadding,Color *bgColor,
                       Color *tintColor)

{
  Color CVar1;
  bool bVar2;
  uint uVar3;
  Texture *this;
  Vector2u VVar4;
  IntRect *pIVar5;
  ImVec2 uv0;
  ImVec2 uv1;
  ImVec2 local_68;
  Vector2f local_60;
  ImVec2 local_58;
  ImVec4 local_50;
  ImVec4 local_40;
  
  this = sf::Sprite::getTexture(sprite);
  if (this == (Texture *)0x0) {
    bVar2 = false;
  }
  else {
    VVar4 = sf::Texture::getSize(this);
    pIVar5 = sf::Sprite::getTextureRect(sprite);
    local_68.x = (float)pIVar5->left / (float)((ulong)VVar4 & 0xffffffff);
    local_68.y = (float)pIVar5->top / (float)((ulong)VVar4 >> 0x20);
    local_58.x = (float)(pIVar5->left + pIVar5->width) / (float)((ulong)VVar4 & 0xffffffff);
    local_58.y = (float)(pIVar5->top + pIVar5->height) / (float)((ulong)VVar4 >> 0x20);
    uVar3 = sf::Texture::getNativeHandle(this);
    local_60 = *size;
    CVar1 = *bgColor;
    local_40.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
    local_40.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
    local_40.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
    local_40.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
    CVar1 = *tintColor;
    local_50.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
    local_50.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
    local_50.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
    local_50.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
    bVar2 = ImageButton((ImTextureID)(ulong)uVar3,(ImVec2 *)&local_60,&local_68,&local_58,
                        framePadding,&local_40,&local_50);
  }
  return bVar2;
}

Assistant:

bool ImageButton(const sf::Sprite& sprite, const sf::Vector2f& size, const int framePadding,
                 const sf::Color& bgColor, const sf::Color& tintColor) {
    const sf::Texture* texturePtr = sprite.getTexture();
    // sprite without texture cannot be drawn
    if (!texturePtr) {
        return false;
    }

    const sf::Texture& texture = *texturePtr;
    sf::Vector2f textureSize = static_cast<sf::Vector2f>(texture.getSize());
    const sf::IntRect& textureRect = sprite.getTextureRect();
    ImVec2 uv0(textureRect.left / textureSize.x, textureRect.top / textureSize.y);
    ImVec2 uv1((textureRect.left + textureRect.width) / textureSize.x,
               (textureRect.top + textureRect.height) / textureSize.y);

    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());
    return ImGui::ImageButton(textureID, ImVec2(size.x, size.y), uv0, uv1, framePadding,
                              toImColor(bgColor), toImColor(tintColor));
}